

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinefieldQueryPdu.cpp
# Opt level: O3

void __thiscall DIS::MinefieldQueryPdu::marshal(MinefieldQueryPdu *this,DataStream *dataStream)

{
  pointer pPVar1;
  pointer pTVar2;
  long lVar3;
  ulong uVar4;
  Point x;
  Point local_40;
  
  MinefieldFamilyPdu::marshal(&this->super_MinefieldFamilyPdu,dataStream);
  EntityID::marshal(&this->_minefieldID,dataStream);
  EntityID::marshal(&this->_requestingEntityID,dataStream);
  DataStream::operator<<(dataStream,this->_requestID);
  DataStream::operator<<
            (dataStream,
             (uchar)((uint)(*(int *)&(this->_requestedPerimeterPoints).
                                     super__Vector_base<DIS::Point,_std::allocator<DIS::Point>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                           *(int *)&(this->_requestedPerimeterPoints).
                                    super__Vector_base<DIS::Point,_std::allocator<DIS::Point>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 4));
  DataStream::operator<<(dataStream,this->_pad2);
  DataStream::operator<<
            (dataStream,
             (uchar)((uint)(*(int *)&(this->_sensorTypes).
                                     super__Vector_base<DIS::TwoByteChunk,_std::allocator<DIS::TwoByteChunk>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                           *(int *)&(this->_sensorTypes).
                                    super__Vector_base<DIS::TwoByteChunk,_std::allocator<DIS::TwoByteChunk>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4));
  DataStream::operator<<(dataStream,this->_dataFilter);
  EntityType::marshal(&this->_requestedMineType,dataStream);
  pPVar1 = (this->_requestedPerimeterPoints).
           super__Vector_base<DIS::Point,_std::allocator<DIS::Point>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_requestedPerimeterPoints).super__Vector_base<DIS::Point,_std::allocator<DIS::Point>_>.
      _M_impl.super__Vector_impl_data._M_finish != pPVar1) {
    lVar3 = 8;
    uVar4 = 0;
    do {
      local_40._vptr_Point = (_func_int **)&PTR__Point_001a0b18;
      local_40._8_8_ = *(undefined8 *)((long)&pPVar1->_vptr_Point + lVar3);
      Point::marshal(&local_40,dataStream);
      Point::~Point(&local_40);
      uVar4 = uVar4 + 1;
      pPVar1 = (this->_requestedPerimeterPoints).
               super__Vector_base<DIS::Point,_std::allocator<DIS::Point>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x10;
    } while (uVar4 < (ulong)((long)(this->_requestedPerimeterPoints).
                                   super__Vector_base<DIS::Point,_std::allocator<DIS::Point>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 >> 4));
  }
  pTVar2 = (this->_sensorTypes).
           super__Vector_base<DIS::TwoByteChunk,_std::allocator<DIS::TwoByteChunk>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_sensorTypes).super__Vector_base<DIS::TwoByteChunk,_std::allocator<DIS::TwoByteChunk>_>
      ._M_impl.super__Vector_impl_data._M_finish != pTVar2) {
    lVar3 = 8;
    uVar4 = 0;
    do {
      local_40._vptr_Point = (_func_int **)&PTR__TwoByteChunk_001a1698;
      local_40._x._0_2_ = *(undefined2 *)(pTVar2->_otherParameters + lVar3 + -8);
      TwoByteChunk::marshal((TwoByteChunk *)&local_40,dataStream);
      TwoByteChunk::~TwoByteChunk((TwoByteChunk *)&local_40);
      uVar4 = uVar4 + 1;
      pTVar2 = (this->_sensorTypes).
               super__Vector_base<DIS::TwoByteChunk,_std::allocator<DIS::TwoByteChunk>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x10;
    } while (uVar4 < (ulong)((long)(this->_sensorTypes).
                                   super__Vector_base<DIS::TwoByteChunk,_std::allocator<DIS::TwoByteChunk>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 4));
  }
  return;
}

Assistant:

void MinefieldQueryPdu::marshal(DataStream& dataStream) const
{
    MinefieldFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _minefieldID.marshal(dataStream);
    _requestingEntityID.marshal(dataStream);
    dataStream << _requestID;
    dataStream << ( unsigned char )_requestedPerimeterPoints.size();
    dataStream << _pad2;
    dataStream << ( unsigned char )_sensorTypes.size();
    dataStream << _dataFilter;
    _requestedMineType.marshal(dataStream);

     for(size_t idx = 0; idx < _requestedPerimeterPoints.size(); idx++)
     {
        Point x = _requestedPerimeterPoints[idx];
        x.marshal(dataStream);
     }


     for(size_t idx = 0; idx < _sensorTypes.size(); idx++)
     {
        TwoByteChunk x = _sensorTypes[idx];
        x.marshal(dataStream);
     }

}